

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

size_t __thiscall
PClassActor::PointerSubstitution(PClassActor *this,DObject *oldclass,DObject *newclass)

{
  uint uVar1;
  PClassPlayerPawn **ppPVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = DObject::PointerSubstitution((DObject *)this,oldclass,newclass);
  uVar1 = (this->VisibleToPlayerClass).Count;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    ppPVar2 = (this->VisibleToPlayerClass).Array;
    if (ppPVar2[uVar4] == (PClassPlayerPawn *)oldclass) {
      ppPVar2[uVar4] = (PClassPlayerPawn *)newclass;
      sVar3 = sVar3 + 1;
    }
  }
  return sVar3;
}

Assistant:

size_t PClassActor::PointerSubstitution(DObject *oldclass, DObject *newclass)
{
	auto changed = Super::PointerSubstitution(oldclass, newclass);
	for (unsigned i = 0; i < VisibleToPlayerClass.Size(); i++)
	{
		if (VisibleToPlayerClass[i] == oldclass)
		{
			VisibleToPlayerClass[i] = static_cast<PClassPlayerPawn*>(newclass);
			changed++;
		}
	}
	return changed;
}